

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O3

bool __thiscall
ArmParser::parseThumbParameters
          (ArmParser *this,Parser *parser,tThumbOpcode *opcode,ThumbOpcodeVariables *vars)

{
  byte symbol;
  int iVar1;
  byte bVar2;
  bool bVar3;
  Token *pTVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  bool bVar9;
  ArmRegisterValue tempRegister;
  ArmRegisterValue local_88;
  ArmRegisterValue *local_60;
  ArmRegisterValue *local_58;
  ArmRegisterValue *local_50;
  int *local_48;
  Expression *local_40;
  ArmParser *local_38;
  
  local_88.name._name._M_dataplus._M_p = (pointer)&local_88.name._name.field_2;
  local_88.name._name.field_2._M_allocated_capacity = 0;
  local_88.name._name.field_2._8_8_ = 0;
  local_88.name._name._M_string_length = 0;
  bVar2 = *opcode->mask;
  local_38 = this;
  if (bVar2 != 0) {
    local_40 = &vars->ImmediateExpression;
    local_48 = &vars->rlist;
    local_60 = &vars->rs;
    local_50 = &vars->ro;
    local_58 = &vars->rn;
    pbVar6 = (byte *)opcode->mask;
    do {
      uVar5 = (ulong)(bVar2 == 0x2f);
      pbVar7 = pbVar6 + uVar5 + 1;
      symbol = pbVar6[uVar5];
      if (symbol < 0x53) {
        if (symbol == 0x44) {
          bVar3 = parseRegisterTable(this,parser,&vars->rd,armRegisters,0x13);
          iVar1 = (vars->rd).num;
          bVar9 = SBORROW4(iVar1,0x10);
          bVar8 = iVar1 + -0x10 < 0;
          goto LAB_00161a1e;
        }
        if (symbol != 0x49) {
          if (symbol == 0x52) {
            bVar3 = parseRegisterList(this,parser,local_48,
                                      (int)(char)pbVar6[uVar5 + 2] << 8 |
                                      (int)(char)pbVar6[uVar5 + 1]);
            if (!bVar3) goto LAB_00161a47;
            pbVar7 = pbVar6 + uVar5 + 3;
            goto LAB_00161a25;
          }
          goto switchD_001618dd_caseD_6a;
        }
switchD_001618dd_caseD_69:
        this = local_38;
        bVar3 = parseImmediate(local_38,parser,local_40);
        if (!bVar3) {
LAB_00161a47:
          bVar3 = false;
          goto LAB_00161a49;
        }
        pbVar7 = pbVar6 + uVar5 + 2;
        vars->ImmediateBitLen = (int)(char)pbVar6[uVar5 + 1];
      }
      else {
        switch(symbol) {
        case 0x69:
          goto switchD_001618dd_caseD_69;
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x70:
        case 0x71:
switchD_001618dd_caseD_6a:
          bVar3 = matchSymbol(this,parser,symbol,bVar2 == 0x2f);
          if (bVar3) goto LAB_00161a25;
          goto LAB_00161a47;
        case 0x6e:
          bVar3 = parseRegisterTable(this,parser,local_58,armRegisters,0x13);
          iVar1 = (vars->rn).num;
          bVar9 = SBORROW4(iVar1,8);
          bVar8 = iVar1 + -8 < 0;
          break;
        case 0x6f:
          bVar3 = parseRegisterTable(this,parser,local_50,armRegisters,0x13);
          iVar1 = (vars->ro).num;
          bVar9 = SBORROW4(iVar1,8);
          bVar8 = iVar1 + -8 < 0;
          break;
        case 0x72:
          bVar3 = parseRegisterTable(this,parser,&local_88,armRegisters,0x13);
          if ((!bVar3 || 0xf < local_88.num) || (local_88.num != (char)pbVar6[uVar5 + 1]))
          goto LAB_00161a47;
          pbVar7 = pbVar6 + uVar5 + 2;
          goto LAB_00161a25;
        case 0x73:
          bVar3 = parseRegisterTable(this,parser,local_60,armRegisters,0x13);
          iVar1 = (vars->rs).num;
          bVar9 = SBORROW4(iVar1,8);
          bVar8 = iVar1 + -8 < 0;
          break;
        default:
          if (symbol == 0x53) {
            bVar3 = parseRegisterTable(this,parser,local_60,armRegisters,0x13);
            iVar1 = (vars->rs).num;
            bVar9 = SBORROW4(iVar1,0x10);
            bVar8 = iVar1 + -0x10 < 0;
          }
          else {
            if (symbol != 100) goto switchD_001618dd_caseD_6a;
            bVar3 = parseRegisterTable(this,parser,&vars->rd,armRegisters,0x13);
            iVar1 = (vars->rd).num;
            bVar9 = SBORROW4(iVar1,8);
            bVar8 = iVar1 + -8 < 0;
          }
        }
LAB_00161a1e:
        if ((bVar3 & bVar9 != bVar8) == 0) goto LAB_00161a47;
      }
LAB_00161a25:
      bVar2 = *pbVar7;
      pbVar6 = pbVar7;
    } while (bVar2 != 0);
  }
  pTVar4 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  bVar3 = pTVar4->type == Separator;
LAB_00161a49:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.name._name._M_dataplus._M_p != &local_88.name._name.field_2) {
    operator_delete(local_88.name._name._M_dataplus._M_p,
                    local_88.name._name.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool ArmParser::parseThumbParameters(Parser& parser, const tThumbOpcode& opcode, ThumbOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	int value;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,7));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,7));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,7));
			break;
		case 'o': // register
			CHECK(parseRegister(parser,vars.ro,7));
			break;
		case 'D': // register
			CHECK(parseRegister(parser,vars.rd,15));
			break;
		case 'S': // register
			CHECK(parseRegister(parser,vars.rs,15));
			break;
		case 'r': // forced register
			CHECK(parseRegister(parser,tempRegister,15));
			CHECK(*encoding++ == tempRegister.num);
			break;
		case 'R':	// register list
			value = encoding[0] | (encoding[1] << 8);
			CHECK(parseRegisterList(parser,vars.rlist,value));
			encoding += 2;
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}
	
	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}